

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__run_pending(uv_loop_t *loop)

{
  uv__io_t *puVar1;
  QUEUE *q_1;
  uv__io_t *w;
  QUEUE pq;
  QUEUE *q;
  uv_loop_t *loop_local;
  
  if (loop->pending_queue == (void **)loop->pending_queue[0]) {
    loop_local._4_4_ = 0;
  }
  else {
    if (loop->pending_queue == (void **)loop->pending_queue[0]) {
      w = (uv__io_t *)&w;
      pq[0] = &w;
    }
    else {
      w = (uv__io_t *)loop->pending_queue[0];
      pq[0] = loop->pending_queue[1];
      *(uv__io_t ***)pq[0] = &w;
      loop->pending_queue[1] = w->pending_queue[0];
      *(void ***)loop->pending_queue[1] = loop->pending_queue;
      w->pending_queue[0] = &w;
    }
    while (puVar1 = w, (uv__io_t *)&w != w) {
      *(uv__io_cb *)w->pending_queue[0] = w->cb;
      *(void **)(w->cb + 8) = w->pending_queue[0];
      w->cb = (uv__io_cb)w;
      puVar1->pending_queue[0] = puVar1;
      (**(code **)&puVar1[-1].fd)(loop,&puVar1[-1].fd,4);
    }
    loop_local._4_4_ = 1;
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__run_pending(uv_loop_t* loop) {
  QUEUE* q;
  QUEUE pq;
  uv__io_t* w;

  if (QUEUE_EMPTY(&loop->pending_queue))
    return 0;

  QUEUE_MOVE(&loop->pending_queue, &pq);

  while (!QUEUE_EMPTY(&pq)) {
    q = QUEUE_HEAD(&pq);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);
    w = QUEUE_DATA(q, uv__io_t, pending_queue);
    w->cb(loop, w, POLLOUT);
  }

  return 1;
}